

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int match_attrs(char *a,size_t alen,char *b,size_t blen)

{
  int iVar1;
  size_t in_RCX;
  void *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  undefined4 local_4;
  
  if (in_RSI == in_RCX) {
    if ((in_RSI == 0) && (in_RCX == 0)) {
      local_4 = 1;
    }
    else {
      iVar1 = memcmp(in_RDI,in_RDX,in_RSI);
      local_4 = (uint)(iVar1 == 0);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int match_attrs(const char *a, size_t alen,
                       const char *b, size_t blen)
{
    /* if the lengths don't match, it's not a match */
    if (alen != blen)
        return FALSE;

    /* if both are empty strings, it's a match */
    if (alen == 0 && blen == 0)
        return TRUE;

    /* compare the strings */
    return memcmp(a, b, alen) == 0;
}